

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxDantzigPR<double>::selectEnterSparseCoDim
          (SPxDantzigPR<double> *this,double *best,SPxId *enterId)

{
  char *pcVar1;
  double *pdVar2;
  DataKey DVar3;
  int *piVar4;
  int n;
  undefined4 in_EDX;
  int extraout_EDX;
  int __c;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  undefined4 in_register_00000014;
  double *in_RSI;
  long in_RDI;
  int i;
  double x;
  int idx;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 local_34;
  double dVar5;
  undefined4 in_stack_ffffffffffffffd8;
  
  local_34 = IdxSet::size((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808));
  __c = extraout_EDX;
  while (local_34 = local_34 - 1, -1 < (int)local_34) {
    pcVar1 = IdxSet::index((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808),(char *)(ulong)local_34,__c)
    ;
    n = (int)pcVar1;
    SPxSolverBase<double>::test(*(SPxSolverBase<double> **)(in_RDI + 0x10));
    pdVar2 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (int)((ulong)in_RDI >> 0x20));
    dVar5 = *pdVar2;
    if (-*(double *)(in_RDI + 0x18) <= dVar5) {
      IdxSet::remove((IdxSet *)(*(long *)(in_RDI + 0x10) + 0x808),(char *)(ulong)local_34);
      piVar4 = DataArray<int>::operator[]((DataArray<int> *)(*(long *)(in_RDI + 0x10) + 0x880),n);
      *piVar4 = 0;
      __c = extraout_EDX_02;
    }
    else {
      __c = extraout_EDX_00;
      if (dVar5 < *in_RSI) {
        DVar3 = (DataKey)SPxSolverBase<double>::id
                                   ((SPxSolverBase<double> *)CONCAT44(n,in_stack_ffffffffffffffd8),
                                    (int)((ulong)dVar5 >> 0x20));
        in_stack_ffffffffffffffc4 = DVar3.info;
        *(DataKey *)CONCAT44(in_register_00000014,in_EDX) = DVar3;
        *in_RSI = dVar5;
        __c = extraout_EDX_01;
      }
    }
  }
  return (SPxId)*(DataKey *)CONCAT44(in_register_00000014,in_EDX);
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterSparseCoDim(R& best, SPxId& enterId)
{
   assert(this->thesolver != nullptr);

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = this->thesolver->test()[idx];

      if(x < -this->thetolerance)
      {
         if(x < best)
         {
            enterId = this->thesolver->id(idx);
            best = x;
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         assert(this->thesolver->isInfeasibleCo[idx] > 0);
         this->thesolver->isInfeasibleCo[idx] = 0;
      }
   }

   return enterId;
}